

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_object_ptr __thiscall
APhyBullet::BulletEngine::createSimpleRigidBody
          (BulletEngine *this,aphy_scalar mass,motion_state_ref *motion_state,
          collision_shape_ref *collision_shape,aphy_vector3 local_inertia)

{
  bool bVar1;
  BulletMotionState *pBVar2;
  BulletCollisionObject *other;
  ref *in_RDX;
  ref *in_RSI;
  btVector3 *in_stack_00000010;
  btCollisionShape *in_stack_00000018;
  btMotionState *in_stack_00000020;
  btScalar in_stack_0000002c;
  btRigidBody *in_stack_00000030;
  BulletCollisionObject *collisionObject;
  ref<aphy::collision_object> result;
  btVector3 inertia;
  ref<aphy::collision_object> *this_00;
  btRigidBody *in_stack_ffffffffffffff68;
  btMotionState *this_01;
  ref<aphy::collision_object> local_50;
  btVector3 local_48;
  ref *local_38;
  ref *local_30;
  btScalar local_18;
  btScalar bStack_14;
  btScalar local_10 [2];
  Counter *local_8;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  bVar1 = aphy::ref::operator_cast_to_bool(in_RSI);
  if ((bVar1) && (bVar1 = aphy::ref::operator_cast_to_bool(local_38), bVar1)) {
    btVector3::btVector3(&local_48,&local_18,&bStack_14,local_10);
    btCollisionObject::operator_new(0x128a1f);
    pBVar2 = aphy::ref<aphy::motion_state>::as<APhyBullet::BulletMotionState>
                       ((ref<aphy::motion_state> *)local_30);
    this_01 = pBVar2->handle;
    aphy::ref<aphy::collision_shape>::as<APhyBullet::BulletCollisionShape>
              ((ref<aphy::collision_shape> *)local_38);
    btRigidBody::btRigidBody
              (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018,
               in_stack_00000010);
    this_00 = &local_50;
    aphy::
    makeObject<APhyBullet::BulletCollisionObject,btRigidBody*,APhyBullet::APhyCollisionObjectType>
              (in_stack_ffffffffffffff68,(APhyCollisionObjectType)((ulong)this_00 >> 0x20));
    other = aphy::ref<aphy::collision_object>::as<APhyBullet::BulletCollisionObject>(this_00);
    aphy::ref<aphy::motion_state>::operator=((ref<aphy::motion_state> *)this_01,(StrongRef *)other);
    aphy::ref<aphy::collision_shape>::operator=
              ((ref<aphy::collision_shape> *)this_01,(StrongRef *)other);
    local_8 = aphy::ref<aphy::collision_object>::disown(&local_50);
    aphy::ref<aphy::collision_object>::~ref(this_00);
  }
  else {
    local_8 = (Counter *)0x0;
  }
  return local_8;
}

Assistant:

collision_object_ptr BulletEngine::createSimpleRigidBody(aphy_scalar mass, const motion_state_ref &motion_state, const collision_shape_ref &collision_shape, aphy_vector3 local_inertia)
{
    if(!motion_state || !collision_shape)
        return nullptr;

    auto inertia = btVector3(local_inertia.x, local_inertia.y, local_inertia.z);
    auto result = makeObject<BulletCollisionObject> (
        new btRigidBody(mass,
            motion_state.as<BulletMotionState> ()->handle,
            collision_shape.as<BulletCollisionShape> ()->handle,
            inertia),
        APhyCollisionObjectType::RigidBody);

    auto collisionObject = result.as<BulletCollisionObject> ();
    collisionObject->motionState = motion_state;
    collisionObject->collisionShape = collision_shape;
    return result.disown();
}